

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector_buffer.hpp
# Opt level: O2

void __thiscall duckdb::DictionaryBuffer::~DictionaryBuffer(DictionaryBuffer *this)

{
  (this->super_VectorBuffer)._vptr_VectorBuffer = (_func_int **)&PTR__DictionaryBuffer_027a66d8;
  ::std::__cxx11::string::~string((string *)&this->dictionary_id);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->sel_vector).selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  VectorBuffer::~VectorBuffer(&this->super_VectorBuffer);
  return;
}

Assistant:

explicit DictionaryBuffer(const SelectionVector &sel)
	    : VectorBuffer(VectorBufferType::DICTIONARY_BUFFER), sel_vector(sel) {
	}